

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O1

void ares_array_destroy(ares_array_t *arr)

{
  ulong uVar1;
  
  if (arr != (ares_array_t *)0x0) {
    if ((arr->destruct != (ares_array_destructor_t)0x0) && (arr->cnt != 0)) {
      uVar1 = 0;
      do {
        (*arr->destruct)((void *)((arr->offset + uVar1) * arr->member_size + (long)arr->arr));
        uVar1 = uVar1 + 1;
      } while (uVar1 < arr->cnt);
    }
    ares_free(arr->arr);
    ares_free(arr);
    return;
  }
  return;
}

Assistant:

void ares_array_destroy(ares_array_t *arr)
{
  size_t i;

  if (arr == NULL) {
    return;
  }

  if (arr->destruct != NULL) {
    for (i = 0; i < arr->cnt; i++) {
      arr->destruct(ares_array_at(arr, i));
    }
  }

  ares_free(arr->arr);
  ares_free(arr);
}